

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O3

bool __thiscall
absl::lts_20250127::str_format_internal::(anonymous_namespace)::
FloatToBuffer<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,double>
          (_anonymous_namespace_ *this,Decomposed<double> decomposed,size_t precision,Buffer *out,
          int *exp)

{
  undefined1 *puVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Buffer *out_00;
  undefined1 digits [16];
  undefined1 digits_00 [16];
  char cVar6;
  size_t sVar7;
  _anonymous_namespace_ *p_Var8;
  ulong uVar9;
  byte bVar10;
  int iVar11;
  _anonymous_namespace_ *p_Var12;
  _anonymous_namespace_ *p_Var13;
  ulong uVar14;
  byte bVar15;
  size_t extra_digits;
  uint uVar16;
  Buffer *pBVar17;
  Buffer *this_00;
  ulong uVar18;
  _anonymous_namespace_ *p_Var19;
  long lVar20;
  ulong uVar21;
  bool bVar22;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  
  uVar21 = decomposed._8_8_;
  if (0x27 < uVar21) {
    return false;
  }
  uVar16 = (uint)decomposed.mantissa;
  *(size_t *)(precision + 0x60) = precision + 0x29;
  *(size_t *)(precision + 0x58) = precision + 0x29;
  bVar10 = (byte)decomposed.mantissa;
  if (-1 < (int)uVar16) {
    if (uVar16 < 0xc) {
      sVar7 = PrintIntegralDigits<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,unsigned_long>
                        ((long)this << (bVar10 & 0x3f),(Buffer *)precision);
      uVar14 = sVar7 - 1;
      *(int *)out->data = (int)uVar14;
      extra_digits = uVar14 - uVar21;
      if (uVar14 < uVar21 || extra_digits == 0) {
        if (extra_digits == 0) {
          return true;
        }
        lVar20 = ~uVar21 + sVar7;
        while (puVar1 = *(undefined1 **)(precision + 0x60),
              puVar1 < (undefined1 *)(precision + 0x55)) {
          *(undefined1 **)(precision + 0x60) = puVar1 + 1;
          *puVar1 = 0x30;
          lVar20 = lVar20 + 1;
          if (lVar20 == 0) {
            return true;
          }
        }
        goto LAB_00255904;
      }
    }
    else {
      if (0x4b < uVar16) {
        return false;
      }
      pBVar17 = (Buffer *)((long)this << (bVar10 & 0x3f));
      this_00 = pBVar17;
      out_00 = (Buffer *)(0L << (bVar10 & 0x3f) | (ulong)this >> 0x40 - (bVar10 & 0x3f));
      if (((undefined1  [16])decomposed & (undefined1  [16])0x40) != (undefined1  [16])0x0) {
        this_00 = (Buffer *)0x0;
        out_00 = pBVar17;
      }
      digits._8_8_ = in_stack_ffffffffffffffc0;
      digits._0_8_ = in_stack_ffffffffffffffb8;
      sVar7 = PrintIntegralDigits<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,unsigned__int128>
                        ((_anonymous_namespace_ *)this_00,(unsigned___int128)digits,out_00);
      uVar14 = sVar7 - 1;
      *(int *)out->data = (int)uVar14;
      extra_digits = uVar14 - uVar21;
      if (uVar14 < uVar21 || extra_digits == 0) {
        if (extra_digits == 0) {
          return true;
        }
        lVar20 = ~uVar21 + sVar7;
        while (puVar1 = *(undefined1 **)(precision + 0x60),
              puVar1 < (undefined1 *)(precision + 0x55)) {
          *(undefined1 **)(precision + 0x60) = puVar1 + 1;
          *puVar1 = 0x30;
          lVar20 = lVar20 + 1;
          if (lVar20 == 0) {
            return true;
          }
        }
LAB_00255904:
        __assert_fail("end < data + sizeof(data)",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                      ,0x3f3,
                      "void absl::str_format_internal::(anonymous namespace)::Buffer::push_back(char)"
                     );
      }
    }
    bVar22 = false;
LAB_002555ee:
    anon_unknown_0::RemoveExtraPrecision(extra_digits,bVar22,(Buffer *)precision,(int *)out);
    return true;
  }
  if (uVar16 < 0xffffffc4) {
    if (uVar16 < 0xffffff84) {
      return false;
    }
    uVar16 = -uVar16;
    bVar10 = (byte)uVar16;
    p_Var12 = (_anonymous_namespace_ *)(-1L << (bVar10 & 0x3f));
    p_Var19 = (_anonymous_namespace_ *)0x0;
    bVar22 = (uVar16 & 0x40) != 0;
    p_Var13 = p_Var12;
    p_Var8 = (_anonymous_namespace_ *)0xffffffffffffffff;
    if (bVar22) {
      p_Var13 = p_Var19;
      p_Var8 = p_Var12;
    }
    p_Var8 = (_anonymous_namespace_ *)~(ulong)p_Var8;
    uVar14 = ~(ulong)p_Var13;
    p_Var13 = (_anonymous_namespace_ *)
              ((ulong)this >> (bVar10 & 0x3f) | 0L << 0x40 - (bVar10 & 0x3f));
    if (bVar22) {
      p_Var13 = p_Var19;
    }
    digits_00._8_8_ = out;
    digits_00._0_8_ = in_stack_ffffffffffffffb8;
    sVar7 = PrintIntegralDigits<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,unsigned__int128>
                      (p_Var13,(unsigned___int128)digits_00,(Buffer *)0x0);
    uVar18 = (ulong)this & uVar14;
    if (sVar7 == 0) {
      out->data[0] = '\0';
      out->data[1] = '\0';
      out->data[2] = '\0';
      out->data[3] = '\0';
      iVar11 = 0;
      if (uVar18 == 0) {
        uVar18 = 0;
        p_Var19 = (_anonymous_namespace_ *)0x0;
      }
      else {
        do {
          auVar3._8_8_ = 0;
          auVar3._0_8_ = uVar18;
          uVar18 = SUB168(auVar3 * ZEXT816(10),0);
          p_Var19 = (_anonymous_namespace_ *)(SUB168(auVar3 * ZEXT816(10),8) + (long)p_Var19 * 10);
          iVar11 = iVar11 + -1;
        } while (p_Var19 <= p_Var8 &&
                 (ulong)(uVar14 < uVar18) <= (ulong)((long)p_Var8 - (long)p_Var19));
        *(int *)out->data = iVar11;
      }
      uVar9 = *(ulong *)(precision + 0x58);
      if (uVar9 <= precision) {
LAB_00255923:
        __assert_fail("begin > data",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                      ,0x3ef,
                      "void absl::str_format_internal::(anonymous namespace)::Buffer::push_front(char)"
                     );
      }
      bVar15 = (byte)((ulong)p_Var19 >> (bVar10 & 0x3f));
      if ((uVar16 & 0x40) == 0) {
        bVar15 = (byte)(uVar18 >> (bVar10 & 0x3f)) | (byte)((long)p_Var19 << 0x40 - (bVar10 & 0x3f))
        ;
      }
      *(ulong *)(precision + 0x58) = uVar9 - 1;
      *(byte *)(uVar9 - 1) = bVar15 + 0x30;
      puVar1 = *(undefined1 **)(precision + 0x60);
      if ((undefined1 *)(precision + 0x55) <= puVar1) goto LAB_00255904;
      *(undefined1 **)(precision + 0x60) = puVar1 + 1;
      *puVar1 = 0x2e;
      uVar18 = uVar18 & uVar14;
      p_Var19 = (_anonymous_namespace_ *)((ulong)p_Var19 & (ulong)p_Var8);
    }
    else {
      uVar9 = sVar7 - 1;
      *(int *)out->data = (int)uVar9;
      extra_digits = uVar9 - uVar21;
      if (uVar21 <= uVar9 && extra_digits != 0) {
        bVar22 = uVar18 != 0;
        goto LAB_002555ee;
      }
      uVar21 = uVar21 - uVar9;
    }
    if (uVar21 != 0) {
      do {
        pcVar2 = *(char **)(precision + 0x60);
        if ((char *)(precision + 0x55) <= pcVar2) goto LAB_00255904;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar18;
        uVar18 = SUB168(auVar4 * ZEXT816(10),0);
        uVar9 = SUB168(auVar4 * ZEXT816(10),8) + (long)p_Var19 * 10;
        bVar15 = (byte)(uVar9 >> (bVar10 & 0x3f));
        if ((uVar16 & 0x40) == 0) {
          bVar15 = (byte)(uVar18 >> (bVar10 & 0x3f)) | (byte)(uVar9 << 0x40 - (bVar10 & 0x3f));
        }
        uVar18 = uVar18 & uVar14;
        p_Var19 = (_anonymous_namespace_ *)(uVar9 & (ulong)p_Var8);
        *(char **)(precision + 0x60) = pcVar2 + 1;
        *pcVar2 = bVar15 + 0x30;
        uVar21 = uVar21 - 1;
      } while (uVar21 != 0);
    }
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar18;
    uVar18 = SUB168(auVar5 * ZEXT816(10),0);
    uVar21 = SUB168(auVar5 * ZEXT816(10),8) + (long)p_Var19 * 10;
    bVar15 = (byte)(uVar21 >> (bVar10 & 0x3f));
    if ((uVar16 & 0x40) == 0) {
      bVar15 = (byte)(uVar18 >> (bVar10 & 0x3f)) | (byte)(uVar21 << 0x40 - (bVar10 & 0x3f));
    }
    if ('\x05' < (char)bVar15) goto LAB_002558ee;
    if (bVar15 != 5) {
      return true;
    }
    if ((uVar21 & (ulong)p_Var8) != 0 || (uVar18 & uVar14) != 0) goto LAB_002558ee;
    cVar6 = *(char *)(*(long *)(precision + 0x60) + -1);
    if (cVar6 == '.') {
      cVar6 = *(char *)(*(long *)(precision + 0x60) + -2);
    }
  }
  else {
    bVar10 = -bVar10;
    uVar18 = ~(-1L << (bVar10 & 0x3f));
    sVar7 = PrintIntegralDigits<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,unsigned_long>
                      ((ulong)this >> (bVar10 & 0x3f),(Buffer *)precision);
    uVar14 = (ulong)this & uVar18;
    if (sVar7 == 0) {
      out->data[0] = '\0';
      out->data[1] = '\0';
      out->data[2] = '\0';
      out->data[3] = '\0';
      iVar11 = 0;
      if (uVar14 == 0) {
        uVar14 = 0;
      }
      else {
        do {
          uVar14 = uVar14 * 10;
          iVar11 = iVar11 + -1;
        } while (uVar14 <= uVar18);
        *(int *)out->data = iVar11;
      }
      uVar9 = *(ulong *)(precision + 0x58);
      if (uVar9 <= precision) goto LAB_00255923;
      *(ulong *)(precision + 0x58) = uVar9 - 1;
      *(char *)(uVar9 - 1) = (char)(uVar14 >> (bVar10 & 0x3f)) + '0';
      puVar1 = *(undefined1 **)(precision + 0x60);
      if ((undefined1 *)(precision + 0x55) <= puVar1) goto LAB_00255904;
      *(undefined1 **)(precision + 0x60) = puVar1 + 1;
      *puVar1 = 0x2e;
      uVar14 = uVar14 & uVar18;
    }
    else {
      uVar9 = sVar7 - 1;
      *(int *)out->data = (int)uVar9;
      extra_digits = uVar9 - uVar21;
      if (uVar21 <= uVar9 && extra_digits != 0) {
        bVar22 = uVar14 != 0;
        goto LAB_002555ee;
      }
      uVar21 = uVar21 - uVar9;
    }
    if (uVar21 != 0) {
      do {
        pcVar2 = *(char **)(precision + 0x60);
        if ((char *)(precision + 0x55) <= pcVar2) goto LAB_00255904;
        uVar9 = uVar14 * 10;
        uVar14 = uVar9 & uVar18;
        *(char **)(precision + 0x60) = pcVar2 + 1;
        *pcVar2 = (char)(uVar9 >> (bVar10 & 0x3f)) + '0';
        uVar21 = uVar21 - 1;
      } while (uVar21 != 0);
    }
    cVar6 = (char)(uVar14 * 10 >> (bVar10 & 0x3f));
    if ('\x05' < cVar6) goto LAB_002558ee;
    if (cVar6 != '\x05') {
      return true;
    }
    if ((uVar14 * 10 & uVar18) != 0) goto LAB_002558ee;
    cVar6 = *(char *)(*(long *)(precision + 0x60) + -1);
    if (cVar6 == '.') {
      cVar6 = *(char *)(*(long *)(precision + 0x60) + -2);
    }
  }
  if (((int)cVar6 & 0x80000001U) != 1) {
    return true;
  }
LAB_002558ee:
  anon_unknown_0::
  RoundUp<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1>
            ((Buffer *)precision,(int *)out);
  return true;
}

Assistant:

bool FloatToBuffer(Decomposed<Float> decomposed,
                   size_t precision,
                   Buffer* out,
                   int* exp) {
  if (precision > kMaxFixedPrecision) return false;

  // Try with uint64_t.
  if (CanFitMantissa<Float, std::uint64_t>() &&
      FloatToBufferImpl<std::uint64_t, Float, mode>(
          static_cast<std::uint64_t>(decomposed.mantissa), decomposed.exponent,
          precision, out, exp))
    return true;

#if defined(ABSL_HAVE_INTRINSIC_INT128)
  // If that is not enough, try with __uint128_t.
  return CanFitMantissa<Float, __uint128_t>() &&
         FloatToBufferImpl<__uint128_t, Float, mode>(
             static_cast<__uint128_t>(decomposed.mantissa), decomposed.exponent,
             precision, out, exp);
#endif
  return false;
}